

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ranges.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Option *pOVar1;
  App *this;
  ostream *poVar2;
  allocator local_526;
  allocator local_525;
  int min;
  int max;
  int step;
  vector<int,_std::allocator<int>_> range;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  App app;
  
  std::__cxx11::string::string
            ((string *)&local_398,"App to demonstrate exclusionary option groups.",
             (allocator *)&range);
  std::__cxx11::string::string((string *)&local_3b8,"",(allocator *)&min);
  CLI::App::App(&app,&local_398,&local_3b8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_398);
  range.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  range.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  range.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_3d8,"--range,-R",(allocator *)&min);
  std::__cxx11::string::string((string *)&local_3f8,"A range",(allocator *)&max);
  pOVar1 = CLI::App::
           add_option<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_(CLI::detail::enabler)0>
                     (&app,&local_3d8,&range,&local_3f8);
  pOVar1->expected_min_ = 2;
  if (pOVar1->expected_max_ < 2) {
    pOVar1->expected_max_ = 2;
  }
  pOVar1->allow_extra_args_ = true;
  pOVar1->flag_like_ = false;
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::string((string *)&local_418,"min_max_step",(allocator *)&min);
  std::__cxx11::string::string((string *)&local_438,"set the min max and step",(allocator *)&max);
  this = &CLI::App::add_option_group<CLI::Option_group>(&app,&local_418,&local_438)->super_App;
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_418);
  min = 0;
  max = 0;
  step = 1;
  std::__cxx11::string::string((string *)&local_458,"--min,-m",&local_525);
  std::__cxx11::string::string((string *)&local_478,"The minimum",&local_526);
  pOVar1 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>(this,&local_458,&min,&local_478);
  (pOVar1->super_OptionBase<CLI::Option>).required_ = true;
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::string((string *)&local_498,"--max,-M",&local_525);
  std::__cxx11::string::string((string *)&local_4b8,"The maximum",&local_526);
  pOVar1 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>(this,&local_498,&max,&local_4b8);
  (pOVar1->super_OptionBase<CLI::Option>).required_ = true;
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::string((string *)&local_4d8,"--step,-s",&local_525);
  std::__cxx11::string::string((string *)&local_4f8,"The step",&local_526);
  pOVar1 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>(this,&local_4d8,&step,&local_4f8)
  ;
  CLI::Option::capture_default_str(pOVar1);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_4d8);
  app.require_option_min_ = 1;
  app.require_option_max_ = 1;
  CLI::App::parse_char_t<char>(&app,argc,argv);
  if (range.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != range.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    if ((long)range.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)range.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start == 8) {
      min = *range.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
      max = range.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[1];
    }
    else if (8 < (ulong)((long)range.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)range.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start)) {
      step = *range.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start;
      min = range.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[1];
      max = range.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[2];
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"range is [");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,min);
  poVar2 = std::operator<<(poVar2,':');
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,step);
  poVar2 = std::operator<<(poVar2,':');
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,max);
  std::operator<<(poVar2,"]\n");
  CLI::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&range.super__Vector_base<int,_std::allocator<int>_>);
  CLI::App::~App(&app);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    CLI::App app{"App to demonstrate exclusionary option groups."};

    std::vector<int> range;
    app.add_option("--range,-R", range, "A range")->expected(-2);

    auto *ogroup = app.add_option_group("min_max_step", "set the min max and step");
    int min{0}, max{0}, step{1};
    ogroup->add_option("--min,-m", min, "The minimum")->required();
    ogroup->add_option("--max,-M", max, "The maximum")->required();
    ogroup->add_option("--step,-s", step, "The step")->capture_default_str();

    app.require_option(1);

    CLI11_PARSE(app, argc, argv);

    if(!range.empty()) {
        if(range.size() == 2) {
            min = range[0];
            max = range[1];
        }
        if(range.size() >= 3) {
            step = range[0];
            min = range[1];
            max = range[2];
        }
    }
    std::cout << "range is [" << min << ':' << step << ':' << max << "]\n";
    return 0;
}